

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_fnmatch.c
# Opt level: O2

int loop(uchar *pattern,uchar *string,int maxstars)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  ulong uVar4;
  bool bVar5;
  uchar *puVar6;
  long lVar7;
  bool bVar8;
  uchar *pp;
  byte local_158 [12];
  int local_14c;
  uchar charset [271];
  
  memset(charset,0,0x10f);
  do {
    bVar1 = *pattern;
    if (bVar1 == 0x3f) {
      if (*string == 0) {
        return 1;
      }
    }
    else if (bVar1 == 0x5b) {
      iVar2 = 0;
      pp = pattern + 1;
      memset(charset,0,0x10f);
      bVar8 = false;
      pbVar3 = pattern + 1;
LAB_0046f77d:
      pattern = pbVar3;
      bVar1 = *pattern;
      uVar4 = (ulong)bVar1;
      if (uVar4 == 0) {
        return 1;
      }
      if (iVar2 == 2) {
        if (bVar1 != 0x5d) {
LAB_0046f865:
          charset[uVar4] = '\x01';
          goto LAB_0046f86a;
        }
        goto LAB_0046fad0;
      }
      if (iVar2 != 1) break;
      if (uVar4 == 0x5b) {
        charset[0x5b] = '\x01';
        pp = pattern + 1;
        iVar2 = 2;
        pbVar3 = pp;
        goto LAB_0046f77d;
      }
      if (bVar1 != 0x5d) {
        if (4 < (byte)(bVar1 - 9) && 0x5e < (byte)(bVar1 - 0x20)) {
          return 1;
        }
        goto LAB_0046f865;
      }
LAB_0046fad0:
      bVar1 = *string;
      uVar4 = (ulong)bVar1;
      if (uVar4 == 0) {
        return 1;
      }
      if (charset[uVar4] == '\0') {
        if (charset[0x101] == '\0') {
          if (charset[0x104] == '\0') {
            if (charset[0x102] != '\0') {
              bVar8 = (byte)(bVar1 - 0x30) < 10;
LAB_0046fb31:
              if ((bool)(charset[0x100] == '\0' ^ bVar8)) {
                return 1;
              }
              goto LAB_0046fac8;
            }
            if (charset[0x103] == '\0') {
              if (charset[0x105] == '\0') {
                if (charset[0x109] == '\0') {
                  if (charset[0x10a] != '\0') goto LAB_0046fb2a;
                  if (charset[0x107] == '\0') {
                    if (charset[0x106] == '\0') {
                      if (charset[0x108] == '\0') {
                        if (charset[0x100] == '\0') {
                          return 1;
                        }
                        goto LAB_0046fac8;
                      }
                      if ((byte)(bVar1 - 9) < 5) goto LAB_0046fae7;
                      bVar8 = (byte)(bVar1 - 0x21) < 0x5e;
                    }
                    else {
                      bVar8 = uVar4 == 9 || uVar4 == 0x20;
                    }
                    goto LAB_0046fb31;
                  }
                  bVar1 = bVar1 + 0x9f;
                  goto LAB_0046fb2c;
                }
                if ((uVar4 != 9) && (bVar1 != 0x20)) {
                  bVar8 = (byte)(bVar1 - 10) < 4;
                  goto LAB_0046fb31;
                }
              }
              else if (4 < (byte)(bVar1 - 9)) {
                bVar8 = (byte)(bVar1 - 0x20) < 0x5f;
                goto LAB_0046fb31;
              }
            }
            else if (5 < (byte)(bVar1 + 0x9f) && 9 < (byte)(bVar1 - 0x30)) {
              bVar8 = (byte)(bVar1 + 0xbf) < 6;
              goto LAB_0046fb31;
            }
          }
          else if (0x19 < (byte)(bVar1 + 0x9f)) goto LAB_0046fb2a;
        }
        else if (0x19 < (byte)(bVar1 + 0x9f) && 9 < (byte)(bVar1 - 0x30)) {
LAB_0046fb2a:
          bVar1 = bVar1 + 0xbf;
LAB_0046fb2c:
          bVar8 = bVar1 < 0x1a;
          goto LAB_0046fb31;
        }
      }
LAB_0046fae7:
      if (charset[0x100] != '\0') {
        return 1;
      }
    }
    else if (bVar1 == 0x5c) {
      bVar1 = pattern[1];
      pbVar3 = pattern + 1;
      if (bVar1 == 0) {
        bVar1 = 0x5c;
        pbVar3 = pattern;
      }
      pattern = pbVar3;
      if (*string != bVar1) {
        return 1;
      }
    }
    else {
      if (bVar1 == 0) {
        return (uint)(*string != 0);
      }
      if (bVar1 == 0x2a) {
        if (maxstars == 0) {
          return 1;
        }
        do {
          do {
            bVar1 = pattern[1];
            pattern = pattern + 1;
          } while (bVar1 == 0x2a);
          if (bVar1 == 0) {
            return 0;
          }
          if (bVar1 != 0x3f) {
            do {
              if (*string == 0) {
                return 1;
              }
              iVar2 = loop(pattern,string,maxstars + -1);
              string = string + 1;
            } while (iVar2 != 0);
            return 0;
          }
          bVar1 = *string;
          string = string + 1;
        } while (bVar1 != 0);
        return 1;
      }
      if (bVar1 != *string) {
        return 1;
      }
    }
LAB_0046fac8:
    pattern = pattern + 1;
    string = string + 1;
  } while( true );
  pbVar3 = pp;
  if (iVar2 != 0) goto LAB_0046f77d;
  switch(bVar1) {
  case 0x5b:
    if (pattern[1] == 0x3a) {
      local_158[8] = 0;
      local_158[9] = 0;
      local_158[0] = 0;
      local_158[1] = 0;
      local_158[2] = 0;
      local_158[3] = 0;
      local_158[4] = 0;
      local_158[5] = 0;
      local_158[6] = 0;
      local_158[7] = 0;
      lVar7 = 0;
      bVar8 = false;
      bVar5 = false;
      while (local_14c = maxstars, !bVar5) {
        if (lVar7 == 10) goto LAB_0046fa6d;
        bVar1 = pattern[lVar7 + 2];
        if (bVar8) {
          bVar8 = true;
          bVar5 = true;
          if (bVar1 != 0x5d) goto LAB_0046fa6d;
        }
        else if ((byte)(bVar1 + 0x9f) < 0x1a) {
          local_158[lVar7] = bVar1;
          bVar8 = false;
          bVar5 = false;
        }
        else {
          bVar5 = false;
          bVar8 = true;
          if (bVar1 != 0x3a) goto LAB_0046fa6d;
        }
        lVar7 = lVar7 + 1;
      }
      iVar2 = bcmp(local_158,"digit",6);
      puVar6 = charset + 0x102;
      if (iVar2 != 0) {
        iVar2 = bcmp(local_158,"alnum",6);
        puVar6 = charset + 0x101;
        if (iVar2 != 0) {
          iVar2 = bcmp(local_158,"alpha",6);
          puVar6 = charset + 0x104;
          if (iVar2 != 0) {
            iVar2 = bcmp(local_158,"xdigit",7);
            puVar6 = charset + 0x103;
            if (iVar2 != 0) {
              iVar2 = bcmp(local_158,"print",6);
              puVar6 = charset + 0x105;
              if (iVar2 != 0) {
                iVar2 = bcmp(local_158,"graph",6);
                puVar6 = charset + 0x108;
                if (iVar2 != 0) {
                  iVar2 = bcmp(local_158,"space",6);
                  puVar6 = charset + 0x109;
                  if (iVar2 != 0) {
                    iVar2 = bcmp(local_158,"blank",6);
                    puVar6 = charset + 0x106;
                    if (iVar2 != 0) {
                      iVar2 = bcmp(local_158,"upper",6);
                      puVar6 = charset + 0x10a;
                      if (iVar2 != 0) {
                        iVar2 = bcmp(local_158,"lower",6);
                        puVar6 = charset + 0x107;
                        maxstars = local_14c;
                        if (iVar2 != 0) goto LAB_0046fa6d;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      pp = pattern + lVar7 + 2;
      *puVar6 = '\x01';
      maxstars = local_14c;
    }
    else {
LAB_0046fa6d:
      pp = pattern + 1;
      charset[0x5b] = '\x01';
    }
    break;
  case 0x5c:
    pp = pattern + 1;
    if (pattern[1] == 0) {
      charset[0x5c] = '\x01';
    }
    else {
LAB_0046f8af:
      setcharorrange(&pp,charset);
    }
    break;
  case 0x5d:
    if (bVar8) goto LAB_0046fad0;
    charset[0x5d] = '\x01';
    pp = pattern + 1;
    bVar8 = true;
    iVar2 = 1;
    pbVar3 = pp;
    goto LAB_0046f77d;
  case 0x5e:
    goto switchD_0046f7b8_caseD_5e;
  default:
    if (bVar1 != 0x21) goto LAB_0046f8af;
    goto switchD_0046f7b8_caseD_5e;
  }
  bVar8 = true;
LAB_0046fa7f:
  iVar2 = 0;
  pbVar3 = pp;
  goto LAB_0046f77d;
switchD_0046f7b8_caseD_5e:
  if (bVar8) {
    puVar6 = charset + uVar4;
  }
  else {
    puVar6 = charset + 0x100;
    if (charset[0x100] != '\0') {
      puVar6 = charset + uVar4;
      bVar8 = true;
    }
  }
  *puVar6 = '\x01';
LAB_0046f86a:
  pp = pattern + 1;
  goto LAB_0046fa7f;
}

Assistant:

static int loop(const unsigned char *pattern, const unsigned char *string,
                int maxstars)
{
  unsigned char *p = (unsigned char *)pattern;
  unsigned char *s = (unsigned char *)string;
  unsigned char charset[CURLFNM_CHSET_SIZE] = { 0 };

  for(;;) {
    unsigned char *pp;

    switch(*p) {
    case '*':
      if(!maxstars)
        return CURL_FNMATCH_NOMATCH;
      /* Regroup consecutive stars and question marks. This can be done because
         '*?*?*' can be expressed as '??*'. */
      for(;;) {
        if(*++p == '\0')
          return CURL_FNMATCH_MATCH;
        if(*p == '?') {
          if(!*s++)
            return CURL_FNMATCH_NOMATCH;
        }
        else if(*p != '*')
          break;
      }
      /* Skip string characters until we find a match with pattern suffix. */
      for(maxstars--; *s; s++) {
        if(loop(p, s, maxstars) == CURL_FNMATCH_MATCH)
          return CURL_FNMATCH_MATCH;
      }
      return CURL_FNMATCH_NOMATCH;
    case '?':
      if(!*s)
        return CURL_FNMATCH_NOMATCH;
      s++;
      p++;
      break;
    case '\0':
      return *s? CURL_FNMATCH_NOMATCH: CURL_FNMATCH_MATCH;
    case '\\':
      if(p[1])
        p++;
      if(*s++ != *p++)
        return CURL_FNMATCH_NOMATCH;
      break;
    case '[':
      pp = p + 1; /* Copy in case of syntax error in set. */
      if(setcharset(&pp, charset)) {
        int found = FALSE;
        if(!*s)
          return CURL_FNMATCH_NOMATCH;
        if(charset[(unsigned int)*s])
          found = TRUE;
        else if(charset[CURLFNM_ALNUM])
          found = ISALNUM(*s);
        else if(charset[CURLFNM_ALPHA])
          found = ISALPHA(*s);
        else if(charset[CURLFNM_DIGIT])
          found = ISDIGIT(*s);
        else if(charset[CURLFNM_XDIGIT])
          found = ISXDIGIT(*s);
        else if(charset[CURLFNM_PRINT])
          found = ISPRINT(*s);
        else if(charset[CURLFNM_SPACE])
          found = ISSPACE(*s);
        else if(charset[CURLFNM_UPPER])
          found = ISUPPER(*s);
        else if(charset[CURLFNM_LOWER])
          found = ISLOWER(*s);
        else if(charset[CURLFNM_BLANK])
          found = ISBLANK(*s);
        else if(charset[CURLFNM_GRAPH])
          found = ISGRAPH(*s);

        if(charset[CURLFNM_NEGATE])
          found = !found;

        if(!found)
          return CURL_FNMATCH_NOMATCH;
        p = pp + 1;
        s++;
        break;
      }
      /* Syntax error in set; mismatch! */
      return CURL_FNMATCH_NOMATCH;

    default:
      if(*p++ != *s++)
        return CURL_FNMATCH_NOMATCH;
      break;
    }
  }
}